

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O0

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,Assignment *ptr)

{
  int *piVar1;
  string *this_00;
  int *val_ptr;
  allocator<char> local_19;
  Assignment *local_18;
  Assignment *ptr_local;
  interpreter_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (Assignment *)this;
  (**(ptr->lvalue->super_Base)._vptr_Base)();
  if (this->lvalue == (int *)0x0) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,"bad lvalue",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  piVar1 = this->lvalue;
  (**(local_18->rvalue->super_Base)._vptr_Base)();
  *piVar1 = this->result;
  return;
}

Assistant:

void interpreter_visitor::visit(Assignment* ptr) {

    ptr->lvalue->accept(this);
    if (lvalue == nullptr)
        throw std::string("bad lvalue");
    auto val_ptr = lvalue;
    ptr->rvalue->accept(this);
    *val_ptr = result;
}